

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

void __thiscall
embree::OBJMaterial::OBJMaterial
          (OBJMaterial *this,float d,Vec3fa *Kd,Vec3fa *Ks,float Ns,string *name)

{
  undefined8 uVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  SceneGraph::Node::Node((Node *)this,&local_48);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_0026df38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__OBJMaterial_0026e5b0;
  (this->base).type = 0;
  this->illum = 0;
  this->d = d;
  this->Ns = Ns;
  this->Ni = 1.0;
  *(undefined8 *)&(this->Ka).field_0 = 0;
  *(undefined8 *)((long)&(this->Ka).field_0 + 8) = 0;
  uVar1 = *(undefined8 *)((long)&Kd->field_0 + 8);
  *(undefined8 *)&(this->Kd).field_0 = *(undefined8 *)&Kd->field_0;
  *(undefined8 *)((long)&(this->Kd).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&Ks->field_0 + 8);
  *(undefined8 *)&(this->Ks).field_0 = *(undefined8 *)&Ks->field_0;
  *(undefined8 *)((long)&(this->Ks).field_0 + 8) = uVar1;
  *(undefined8 *)&(this->Kt).field_0 = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->Kt).field_0 + 8) = 0x3f8000003f800000;
  memset(&this->map_d,0,0xa8);
  return;
}

Assistant:

OBJMaterial (float d, const Vec3fa& Kd, const Vec3fa& Ks, const float Ns, const std::string name = "")
      : base(MATERIAL_OBJ), illum(0), d(d), Ns(Ns), Ni(1.f), Ka(0.f), Kd(Kd), Ks(Ks), Kt(1.0f),
        map_d(nullptr), map_Ka(nullptr), map_Kd(nullptr), map_Ks(nullptr), map_Kt(nullptr), map_Ns(nullptr), map_Displ(nullptr) {}